

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O2

double __thiscall
Jupiter::IRC::Client::readConfigDouble(Client *this,string_view key,double defaultValue)

{
  double dVar1;
  string_view sVar2;
  
  if (this->m_primary_section != (Config *)0x0) {
    sVar2 = Config::get(this->m_primary_section,key,(string_view)ZEXT816(0));
    if (sVar2._M_len != 0) {
      dVar1 = Jupiter_strtod_s(sVar2._M_str,sVar2._M_len);
      return dVar1;
    }
  }
  if (this->m_secondary_section != (Config *)0x0) {
    dVar1 = Config::get<double>(this->m_secondary_section,key,defaultValue);
    return dVar1;
  }
  return defaultValue;
}

Assistant:

double Jupiter::IRC::Client::readConfigDouble(std::string_view key, double defaultValue) const {
	if (m_primary_section != nullptr) {
		std::string_view val = m_primary_section->get(key);

		if (!val.empty()) {
			return Jupiter::from_string<double>(val);
		}
	}

	if (m_secondary_section != nullptr) {
		return m_secondary_section->get<double>(key, defaultValue);
	}

	return defaultValue;
}